

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.cpp
# Opt level: O3

ProcessGroupIndex * __thiscall
adios2::format::BPBase::ReadProcessGroupIndexHeader
          (ProcessGroupIndex *__return_storage_ptr__,BPBase *this,
          vector<char,_std::allocator<char>_> *buffer,size_t *position,bool isLittleEndian)

{
  char cVar1;
  uint16_t uVar2;
  int32_t iVar3;
  uint32_t uVar4;
  pointer pcVar5;
  size_t sVar6;
  uint64_t uVar7;
  string local_50;
  
  (__return_storage_ptr__->Name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Name).field_2
  ;
  (__return_storage_ptr__->Name)._M_string_length = 0;
  (__return_storage_ptr__->Name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->StepName)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->StepName).field_2;
  (__return_storage_ptr__->StepName)._M_string_length = 0;
  (__return_storage_ptr__->StepName).field_2._M_local_buf[0] = '\0';
  uVar2 = *(uint16_t *)
           ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start + *position);
  *position = *position + 2;
  __return_storage_ptr__->Length = uVar2;
  ReadBPString_abi_cxx11_(&local_50,this,buffer,position,false);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Name,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar5 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  sVar6 = *position;
  cVar1 = pcVar5[sVar6];
  *position = sVar6 + 1;
  __return_storage_ptr__->IsColumnMajor = cVar1;
  iVar3 = *(int32_t *)(pcVar5 + sVar6 + 1);
  *position = sVar6 + 5;
  __return_storage_ptr__->ProcessID = iVar3;
  ReadBPString_abi_cxx11_(&local_50,(BPBase *)(sVar6 + 1),buffer,position,false);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->StepName,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar5 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  sVar6 = *position;
  uVar4 = *(uint32_t *)(pcVar5 + sVar6);
  *position = sVar6 + 4;
  __return_storage_ptr__->Step = uVar4;
  uVar7 = *(uint64_t *)(pcVar5 + sVar6 + 4);
  *position = sVar6 + 0xc;
  __return_storage_ptr__->Offset = uVar7;
  return __return_storage_ptr__;
}

Assistant:

BPBase::ProcessGroupIndex
BPBase::ReadProcessGroupIndexHeader(const std::vector<char> &buffer, size_t &position,
                                    const bool isLittleEndian) const noexcept
{
    ProcessGroupIndex index;
    index.Length = helper::ReadValue<uint16_t>(buffer, position, isLittleEndian);
    index.Name = ReadBPString(buffer, position, isLittleEndian);
    index.IsColumnMajor = helper::ReadValue<char>(buffer, position, isLittleEndian);
    index.ProcessID = helper::ReadValue<int32_t>(buffer, position, isLittleEndian);
    index.StepName = ReadBPString(buffer, position, isLittleEndian);
    index.Step = helper::ReadValue<uint32_t>(buffer, position, isLittleEndian);
    index.Offset = helper::ReadValue<uint64_t>(buffer, position, isLittleEndian);
    return index;
}